

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O3

void __thiscall webrtc::Histogram::~Histogram(Histogram *this)

{
  int *piVar1;
  
  piVar1 = (this->hist_bin_index_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t
           .super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  (this->hist_bin_index_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  piVar1 = (this->activity_probability_)._M_t.
           super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  (this->activity_probability_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  return;
}

Assistant:

Histogram::~Histogram() {}